

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.hpp
# Opt level: O3

void Qentem::StringUtils::EscapeHTMLSpecialChars<Qentem::StringStream<char>,char>
               (StringStream<char> *stream,char *str,SizeT length)

{
  byte bVar1;
  SizeT offset_2;
  uint uVar2;
  long lVar3;
  uint uVar4;
  char *from;
  char *to;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = 0;
  if (length == 0) {
LAB_0011d0be:
    uVar4 = stream->length_;
    uVar2 = uVar4 + (length - uVar6);
    if (stream->capacity_ < uVar2) {
      StringStream<char>::expand(stream,uVar2);
      uVar4 = stream->length_;
    }
    Memory::Copy<unsigned_int>(stream->storage_ + uVar4,str + uVar6,length - uVar6);
    stream->length_ = uVar2;
    return;
  }
  uVar7 = 0;
LAB_0011cd7c:
  iVar5 = (int)uVar7;
  bVar1 = str[uVar7];
  if (bVar1 < 0x27) {
    if (bVar1 == 0x22) {
      uVar4 = stream->length_;
      uVar2 = uVar4 + (iVar5 - uVar6);
      if (stream->capacity_ < uVar2) {
        StringStream<char>::expand(stream,uVar2);
        uVar4 = stream->length_;
      }
      Memory::Copy<unsigned_int>(stream->storage_ + uVar4,str + uVar6,iVar5 - uVar6);
      stream->length_ = uVar2;
      uVar4 = uVar2 + 6;
      if (stream->capacity_ < uVar4) {
        StringStream<char>::expand(stream,uVar4);
        uVar2 = stream->length_;
      }
      to = stream->storage_ + uVar2;
      from = "&quot;";
      goto LAB_0011cf75;
    }
    if (bVar1 != 0x26) {
LAB_0011cf97:
      uVar7 = (ulong)(iVar5 + 1);
      goto LAB_0011cf88;
    }
    uVar2 = length - iVar5;
    if (uVar2 < 6) {
LAB_0011cfcc:
      if (uVar2 < 5) {
LAB_0011d001:
        if (3 < uVar2) goto LAB_0011d006;
LAB_0011d059:
        uVar4 = stream->length_;
        uVar2 = uVar4 + (iVar5 - uVar6);
        if (stream->capacity_ < uVar2) {
          StringStream<char>::expand(stream,uVar2);
          uVar4 = stream->length_;
        }
        Memory::Copy<unsigned_int>(stream->storage_ + uVar4,str + uVar6,iVar5 - uVar6);
        stream->length_ = uVar2;
        uVar4 = uVar2 + 5;
        if (stream->capacity_ < uVar4) {
          StringStream<char>::expand(stream,uVar4);
          uVar2 = stream->length_;
        }
        to = stream->storage_ + uVar2;
        from = "&amp;";
        uVar6 = 5;
        goto LAB_0011cf7a;
      }
LAB_0011cfd1:
      if (str[uVar7 + 4] == ';') {
        lVar3 = 0;
        do {
          if (str[lVar3 + uVar7] != "&amp;&amp;&amp;&amp;&amp;"[lVar3 + 0x14]) {
            if (lVar3 != 4) goto LAB_0011d001;
            break;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        uVar7 = (ulong)(iVar5 + 5);
        goto LAB_0011cf88;
      }
LAB_0011d006:
      if (str[uVar7 + 3] != ';') goto LAB_0011d059;
      lVar3 = 0;
      do {
        if (str[lVar3 + uVar7] != "&lt;&lt;&lt;&lt;&lt;"[lVar3 + 0x10]) {
          if (lVar3 != 3) {
            lVar3 = 0;
            goto LAB_0011d030;
          }
          break;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      goto LAB_0011d050;
    }
    if (str[uVar7 + 5] != ';') goto LAB_0011cfd1;
    lVar3 = 0;
    do {
      if (str[lVar3 + uVar7] != "&lt;&gt;&amp;&apos;&quot;"[lVar3 + 0x13]) {
        if (lVar3 != 5) {
          lVar3 = 0;
          goto LAB_0011cfa4;
        }
        break;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    goto LAB_0011cfc6;
  }
  if (bVar1 == 0x27) {
    uVar4 = stream->length_;
    uVar2 = uVar4 + (iVar5 - uVar6);
    if (stream->capacity_ < uVar2) {
      StringStream<char>::expand(stream,uVar2);
      uVar4 = stream->length_;
    }
    Memory::Copy<unsigned_int>(stream->storage_ + uVar4,str + uVar6,iVar5 - uVar6);
    stream->length_ = uVar2;
    uVar4 = uVar2 + 6;
    if (stream->capacity_ < uVar4) {
      StringStream<char>::expand(stream,uVar4);
      uVar2 = stream->length_;
    }
    to = stream->storage_ + uVar2;
    from = "&apos;";
LAB_0011cf75:
    uVar6 = 6;
  }
  else {
    if (bVar1 == 0x3c) {
      uVar4 = stream->length_;
      uVar2 = uVar4 + (iVar5 - uVar6);
      if (stream->capacity_ < uVar2) {
        StringStream<char>::expand(stream,uVar2);
        uVar4 = stream->length_;
      }
      Memory::Copy<unsigned_int>(stream->storage_ + uVar4,str + uVar6,iVar5 - uVar6);
      stream->length_ = uVar2;
      uVar4 = uVar2 + 4;
      if (stream->capacity_ < uVar4) {
        StringStream<char>::expand(stream,uVar4);
        uVar2 = stream->length_;
      }
      to = stream->storage_ + uVar2;
      from = "&lt;";
    }
    else {
      if (bVar1 != 0x3e) goto LAB_0011cf97;
      uVar4 = stream->length_;
      uVar2 = uVar4 + (iVar5 - uVar6);
      if (stream->capacity_ < uVar2) {
        StringStream<char>::expand(stream,uVar2);
        uVar4 = stream->length_;
      }
      Memory::Copy<unsigned_int>(stream->storage_ + uVar4,str + uVar6,iVar5 - uVar6);
      stream->length_ = uVar2;
      uVar4 = uVar2 + 4;
      if (stream->capacity_ < uVar4) {
        StringStream<char>::expand(stream,uVar4);
        uVar2 = stream->length_;
      }
      to = stream->storage_ + uVar2;
      from = "&gt;";
    }
    uVar6 = 4;
  }
LAB_0011cf7a:
  Memory::Copy<unsigned_int>(to,from,uVar6);
  uVar6 = iVar5 + 1;
  uVar7 = (ulong)uVar6;
  stream->length_ = uVar4;
  goto LAB_0011cf88;
  while (lVar3 = lVar3 + 1, lVar3 != 5) {
LAB_0011cfa4:
    if (str[lVar3 + uVar7] !=
        " &lt; &lt; &gt; &gt; &amp; &amp; &quot; &quot; &apos; &apos;"[lVar3 + 0x36]) {
      if (lVar3 != 5) goto LAB_0011cfcc;
      break;
    }
  }
LAB_0011cfc6:
  uVar7 = (ulong)(iVar5 + 6);
LAB_0011cf88:
  if (length <= (uint)uVar7) goto LAB_0011d0be;
  goto LAB_0011cd7c;
  while (lVar3 = lVar3 + 1, lVar3 != 3) {
LAB_0011d030:
    if (str[lVar3 + uVar7] != "&lt;&amp;&gt;"[lVar3 + 9]) {
      if (lVar3 != 3) goto LAB_0011d059;
      break;
    }
  }
LAB_0011d050:
  uVar7 = (ulong)(iVar5 + 4);
  goto LAB_0011cf88;
}

Assistant:

static void EscapeHTMLSpecialChars(StringStream_T &stream, const Char_T *str, SizeT length) {
    using HTMLSpecialChars = HTMLSpecialChars_T<Char_T, sizeof(Char_T)>;

    if (Config::AutoEscapeHTML) {
        SizeT offset = 0;
        SizeT index  = 0;

        while (index < length) {
            switch (str[index]) {
                case '&': {
                    const SizeT   rem_length = (length - index);
                    const Char_T *n_str      = (str + index);

                    if ((rem_length > SizeT{5}) && (n_str[SizeT{5}] == HTMLSpecialChars::SemicolonChar)) {
                        if (StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLQuote, SizeT{5}) ||
                            StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLSingleQuote, SizeT{5})) {
                            index += SizeT{6};
                            break;
                        }
                    }

                    if ((rem_length > SizeT{4}) && (n_str[SizeT{4}] == HTMLSpecialChars::SemicolonChar) &&
                        StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLAnd, SizeT{4})) {
                        index += SizeT{5};
                        break;
                    }

                    if ((rem_length > SizeT{3}) && (n_str[SizeT{3}] == HTMLSpecialChars::SemicolonChar)) {
                        if (StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLLess, SizeT{3}) ||
                            StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLGreater, SizeT{3})) {
                            index += SizeT{4};
                            break;
                        }
                    }

                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLAnd, HTMLSpecialChars::HTMLAndLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '<': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLLess, HTMLSpecialChars::HTMLLessLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '>': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLGreater, HTMLSpecialChars::HTMLGreaterLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '"': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLQuote, HTMLSpecialChars::HTMLQuoteLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '\'': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLSingleQuote, HTMLSpecialChars::HTMLSingleQuoteLength);
                    ++index;
                    offset = index;
                    break;
                }

                default: {
                    ++index;
                }
            }
        }

        stream.Write((str + offset), (length - offset));
    } else {
        stream.Write(str, length);
    }
}